

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.c
# Opt level: O0

char * preprocess(char *source)

{
  int iVar1;
  char *pcVar2;
  FILE *source_00;
  char *back;
  char *pcVar3;
  char *content;
  FILE *include;
  char *toInclude;
  char *line;
  char *bak;
  char *result;
  uint local_18;
  int hasInclude;
  int lcount;
  int i;
  char *source_local;
  
  hasInclude = 0;
  local_18 = 0;
  result._4_4_ = 0;
  inprocess = inprocess + 1;
  _lcount = source;
  bak = (char *)malloc(1);
  *bak = '\0';
  while (_lcount[hasInclude] != '\0') {
    toInclude = readline(_lcount,&hasInclude);
    local_18 = local_18 + 1;
    iVar1 = startsWith(toInclude,"Include");
    if (iVar1 == 0) {
      iVar1 = isEmpty(toInclude);
      if (iVar1 == 0) {
        iVar1 = is_start_of_mc(toInclude);
        if (iVar1 == 0) {
          pcVar2 = str_append(bak,toInclude);
          free(bak);
          free(toInclude);
          bak = pcVar2;
        }
        else {
          while (iVar1 = is_end_of_mc(toInclude), iVar1 == 0) {
            free(toInclude);
            toInclude = readline(_lcount,&hasInclude);
          }
          free(toInclude);
        }
      }
    }
    else {
      pcVar2 = str_part(toInclude,8);
      iVar1 = has_in_table(pcVar2);
      if (iVar1 == 0) {
        source_00 = fopen(pcVar2,"rb");
        if (source_00 == (FILE *)0x0) {
          printf("\x1b[33m\n[Warning] [Line %d] Unable to open file for inclusion : %s\x1b[0m",
                 (ulong)local_18,pcVar2);
        }
        else {
          result._4_4_ = result._4_4_ + 1;
          back = read_all((FILE *)source_00);
          add_to_table(pcVar2);
          pcVar3 = str_append(bak,back);
          free(back);
          free(bak);
          bak = pcVar3;
        }
        free(pcVar2);
      }
      else {
        printf("\x1b[32m\n[Debug] [Preprocessor] Skipping duplicate inclusion of %s\x1b[0m",pcVar2);
        free(pcVar2);
        free(toInclude);
      }
    }
  }
  free(_lcount);
  if (result._4_4_ != 0) {
    bak = preprocess(bak);
  }
  inprocess = inprocess + -1;
  if (inprocess == 0) {
    for (hasInclude = 0; hasInclude < count; hasInclude = hasInclude + 1) {
      free(inclusionTable[hasInclude]);
    }
    free(inclusionTable);
  }
  return bak;
}

Assistant:

char* preprocess(char *source){
    int i = 0, lcount = 0, hasInclude = 0;
    inprocess++;
    char *result = (char *)mallocate(sizeof(char) * 1), *bak = NULL;
    result[0] = '\0';
    while(source[i] != '\0'){
        char *line = readline(source, &i);
     //   printf(debug("Line : [%s]"), line);
        lcount++;
        if(startsWith(line, "Include")){
            char *toInclude = str_part(line, 8); // Include
            if(has_in_table(toInclude)){
                printf(debug("[Preprocessor] Skipping duplicate inclusion of %s"), toInclude);
                memfree(toInclude);
                memfree(line);
                continue;
            }
            FILE *include = fopen(toInclude, "rb");
            if(include == NULL)
                printf(warning("[Line %d] Unable to open file for inclusion : %s"), lcount, toInclude);
            else{
                hasInclude++;
                char *content = read_all(include);
                add_to_table(toInclude);
                bak = result;
                result = str_append(result, content);
                memfree(content);
                memfree(bak);
            }
            memfree(toInclude);
        }
        else if(!isEmpty(line)){
            if(is_start_of_mc(line)){
                while(!is_end_of_mc(line)){
                    memfree(line);
                    line = readline(source, &i);
                }
                memfree(line);
            }
            else{
                bak = result;
                result = str_append(result, line);
                memfree(bak);
                memfree(line);
            }
        }
       // memfree(line);
    }
    memfree(source);
    if(hasInclude){
        result = preprocess(result);
    }
    inprocess--;
    if(inprocess == 0){
        i = 0;
        while(i < count){
            memfree(inclusionTable[i]);
            i++;
        }
        memfree(inclusionTable);
    }
    return result;
}